

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall
trompeloeil::
call_matcher_list<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::call_matcher_list(call_matcher_list<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *this,call_matcher_list<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *param_1)

{
  list<trompeloeil::call_matcher_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::ignore_disposer>
  ::list(&this->
          super_list<trompeloeil::call_matcher_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::ignore_disposer>
         ,&param_1->
           super_list<trompeloeil::call_matcher_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::ignore_disposer>
        );
  (this->
  super_list<trompeloeil::call_matcher_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::ignore_disposer>
  ).
  super_list_elem<trompeloeil::call_matcher_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ._vptr_list_elem = (_func_int **)&PTR__list_003ceb28;
  return;
}

Assistant:

void decommission()
    {
      auto lock = get_lock();
      auto iter = this->begin();
      auto const e = this->end();
      while (iter != e)
      {
        auto &m = *iter;
        ++iter; // intrusive list, so must advance to next before destroying
        m.mock_destroyed();
        m.unlink();
      }
    }